

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Pattern::visit<slang::analysis::DataFlowAnalysis>
          (Pattern *this,DataFlowAnalysis *visitor)

{
  (*(code *)(&DAT_0044c87c + *(int *)(&DAT_0044c87c + (ulong)this->kind * 4)))
            (this,this,&DAT_0044c87c,&DAT_0044c87c + *(int *)(&DAT_0044c87c + (ulong)this->kind * 4)
            );
  return;
}

Assistant:

decltype(auto) Pattern::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case PatternKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidPattern);
        CASE(Wildcard, WildcardPattern);
        CASE(Constant, ConstantPattern);
        CASE(Variable, VariablePattern);
        CASE(Tagged, TaggedPattern);
        CASE(Structure, StructurePattern);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}